

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O2

void __thiscall
Memory::SmallHeapBlockT<SmallAllocationBlockAttributes>::CheckDebugFreeBitVector
          (SmallHeapBlockT<SmallAllocationBlockAttributes> *this,bool isCollecting)

{
  code *pcVar1;
  bool bVar2;
  BOOLEAN BVar3;
  ushort uVar4;
  BVIndex BVar5;
  undefined4 *puVar6;
  FreeObject *objectAddress;
  undefined7 in_register_00000031;
  uint uVar7;
  FreeObject *local_38;
  FreeObject *freeObject;
  
  local_38 = this->freeObjectList;
  if ((int)CONCAT71(in_register_00000031,isCollecting) == 0) {
    (*(this->super_HeapBlock)._vptr_HeapBlock[0x10])(this,&local_38);
  }
  objectAddress = local_38;
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  uVar7 = 0;
  while (objectAddress != (FreeObject *)0x0) {
    uVar4 = GetAddressIndex(this,objectAddress);
    if (uVar4 == 0xffff) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                         ,0x6fb,"(index != SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit)",
                         "index != SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit");
      if (!bVar2) goto LAB_0062119e;
      *puVar6 = 0;
    }
    uVar4 = GetAddressBitIndex(local_38);
    BVar3 = BVStatic<256UL>::Test(&this->debugFreeBits,(uint)uVar4);
    if (BVar3 == '\0') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                         ,0x6fc,
                         "(this->GetDebugFreeBitVector()->Test(GetAddressBitIndex(freeObject)))",
                         "this->GetDebugFreeBitVector()->Test(GetAddressBitIndex(freeObject))");
      if (!bVar2) goto LAB_0062119e;
      *puVar6 = 0;
    }
    uVar7 = uVar7 + 1;
    objectAddress = FreeObject::GetNext(local_38);
    local_38 = objectAddress;
  }
  BVar5 = BVStatic<256UL>::Count(&this->debugFreeBits);
  if (BVar5 != uVar7) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x700,"(this->GetDebugFreeBitVector()->Count() == verifyFreeCount)",
                       "this->GetDebugFreeBitVector()->Count() == verifyFreeCount");
    if (!bVar2) goto LAB_0062119e;
    *puVar6 = 0;
  }
  if (this->lastFreeCount < uVar7) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x701,"(verifyFreeCount <= this->lastFreeCount)",
                       "verifyFreeCount <= this->lastFreeCount");
    if (!bVar2) {
LAB_0062119e:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  return;
}

Assistant:

void
SmallHeapBlockT<TBlockAttributes>::CheckDebugFreeBitVector(bool isCollecting)
{
    FreeObject * freeObject = this->freeObjectList;

    if (!isCollecting)
    {
        this->GetFreeObjectListOnAllocator(&freeObject);
    }

    uint verifyFreeCount = 0;
    while (freeObject != nullptr)
    {
        uint index = this->GetAddressIndex(freeObject);
        Assert(index != SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit);
        Assert(this->GetDebugFreeBitVector()->Test(GetAddressBitIndex(freeObject)));
        verifyFreeCount++;
        freeObject = freeObject->GetNext();
    }
    Assert(this->GetDebugFreeBitVector()->Count() == verifyFreeCount);
    Assert(verifyFreeCount <= this->lastFreeCount);
}